

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_qmfb.c
# Opt level: O1

int jpc_ns_synthesize(jpc_fix_t *a,int xstart,int ystart,int width,int height,int stride)

{
  jpc_fix_t *pjVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  long *plVar6;
  jpc_fix_t *pjVar7;
  jpc_fix_t *pjVar8;
  uint uVar9;
  long *plVar10;
  jpc_fix_t *pjVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  long *plVar15;
  jpc_fix_t *pjVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  jpc_fix_t *pjVar21;
  uint n;
  uint uVar22;
  uint uVar23;
  int iVar24;
  bool bVar25;
  bool bVar26;
  uint llen;
  uint local_78;
  jpc_fix_t *local_70;
  jpc_fix_t *local_68;
  
  if (height != 0) {
    uVar23 = xstart & 1;
    uVar2 = (uVar23 ^ 1) + width;
    uVar14 = uVar2 >> 1;
    uVar12 = (ulong)uVar14;
    uVar18 = uVar14 - (uVar23 == 0);
    local_78 = width & 1;
    bVar25 = (width & 1U) == uVar23;
    uVar3 = (uint)bVar25;
    uVar9 = (uint)!bVar25;
    uVar22 = (width - uVar14) - uVar23;
    iVar20 = (uVar9 - uVar14) + (uint)(uVar23 == 0);
    pjVar8 = a + uVar12;
    iVar13 = 0;
    pjVar11 = a;
    do {
      if (1 < (uint)width) {
        if (1 < uVar2) {
          lVar4 = 0;
          do {
            pjVar11[lVar4] = pjVar11[lVar4] * 0x275d >> 0xd;
            lVar4 = lVar4 + 1;
          } while (uVar14 != (uint)lVar4);
        }
        uVar5 = uVar12;
        if (width - uVar14 != 0) {
          do {
            pjVar11[uVar5] = pjVar11[uVar5] * 0x3406 >> 0xd;
            uVar5 = uVar5 + 1;
          } while (width != (int)uVar5);
        }
        plVar6 = pjVar11 + uVar12;
        plVar10 = pjVar11;
        if (uVar23 == 0) {
          *pjVar11 = *pjVar11 - (*plVar6 * 0x1c62 >> 0xd);
          plVar10 = pjVar11 + 1;
        }
        plVar15 = plVar6;
        if (uVar18 != uVar9) {
          lVar19 = 0;
          lVar4 = 0;
          do {
            plVar10[lVar4] = plVar10[lVar4] - ((pjVar8[lVar4 + 1] + pjVar8[lVar4]) * 0xe31 >> 0xd);
            lVar4 = lVar4 + 1;
            lVar19 = lVar19 + -8;
          } while ((int)lVar4 + iVar20 != 0);
          plVar10 = (long *)((long)plVar10 - lVar19);
          plVar15 = (long *)((long)pjVar8 - lVar19);
        }
        if (local_78 != uVar23) {
          *plVar10 = *plVar10 - (*plVar15 * 0x1c62 >> 0xd);
        }
        plVar10 = plVar6;
        if (uVar23 != 0) {
          *plVar6 = *plVar6 - (*pjVar11 * 0x3881 >> 0xd);
          plVar10 = plVar6 + 1;
        }
        plVar15 = pjVar11;
        if (uVar22 != uVar3) {
          lVar19 = 0;
          lVar4 = 0;
          do {
            plVar10[lVar4] =
                 plVar10[lVar4] - ((pjVar11[lVar4 + 1] + pjVar11[lVar4]) * 0x1c40 >> 0xd);
            lVar4 = lVar4 + 1;
            lVar19 = lVar19 + -8;
          } while (uVar22 - uVar3 != (int)lVar4);
          plVar10 = (long *)((long)plVar10 - lVar19);
          plVar15 = (long *)((long)pjVar11 - lVar19);
        }
        if (local_78 == uVar23) {
          *plVar10 = *plVar10 - (*plVar15 * 0x3881 >> 0xd);
        }
        plVar10 = pjVar11;
        if (uVar23 == 0) {
          *pjVar11 = *pjVar11 - (*plVar6 * -0x364 >> 0xd);
          plVar10 = pjVar11 + 1;
        }
        plVar15 = plVar6;
        if (uVar18 != uVar9) {
          lVar19 = 0;
          lVar4 = 0;
          do {
            plVar10[lVar4] = plVar10[lVar4] - ((pjVar8[lVar4 + 1] + pjVar8[lVar4]) * -0x1b2 >> 0xd);
            lVar4 = lVar4 + 1;
            lVar19 = lVar19 + -8;
          } while ((int)lVar4 + iVar20 != 0);
          plVar10 = (long *)((long)plVar10 - lVar19);
          plVar15 = (long *)((long)pjVar8 - lVar19);
        }
        if (local_78 != uVar23) {
          *plVar10 = *plVar10 - (*plVar15 * -0x364 >> 0xd);
        }
        if (uVar23 != 0) {
          *plVar6 = *plVar6 - (*pjVar11 * -0x6583 >> 0xd);
          plVar6 = plVar6 + 1;
        }
        plVar10 = pjVar11;
        if (uVar22 != uVar3) {
          lVar4 = 0;
          lVar19 = 0;
          do {
            plVar6[lVar19] =
                 plVar6[lVar19] - ((pjVar11[lVar19 + 1] + pjVar11[lVar19]) * -0x32c1 >> 0xd);
            lVar19 = lVar19 + 1;
            lVar4 = lVar4 + -8;
          } while (uVar22 - uVar3 != (int)lVar19);
          plVar6 = (long *)((long)plVar6 - lVar4);
          plVar10 = (long *)((long)pjVar11 - lVar4);
        }
        if (local_78 == uVar23) {
          *plVar6 = *plVar6 - (*plVar10 * -0x6583 >> 0xd);
        }
      }
      jpc_qmfb_join_row(pjVar11,width,uVar23);
      pjVar11 = pjVar11 + stride;
      iVar13 = iVar13 + 1;
      pjVar8 = pjVar8 + stride;
    } while (iVar13 != height);
  }
  uVar2 = ystart & 1;
  uVar3 = width & 0xfffffff0;
  if (uVar3 != 0) {
    uVar14 = (height - uVar2) + 1;
    uVar9 = uVar14 >> 1;
    uVar12 = (ulong)(uVar9 * stride);
    iVar13 = height - uVar9;
    uVar22 = height & 1;
    iVar20 = (uVar9 - (uVar2 == 0)) - (uint)(uVar22 != uVar2);
    iVar24 = (iVar13 - uVar2) - (uint)(uVar22 == uVar2);
    pjVar8 = a + uVar12;
    local_68 = a + (uint)stride + uVar12;
    local_70 = a + (uint)stride;
    uVar18 = 0;
    do {
      if (1 < (uint)height) {
        pjVar7 = a;
        uVar23 = uVar9;
        iVar17 = iVar13;
        pjVar11 = pjVar8;
        if (1 < uVar14) {
          do {
            lVar4 = 0;
            do {
              pjVar7[lVar4] = pjVar7[lVar4] * 0x275d >> 0xd;
              lVar4 = lVar4 + 1;
            } while ((int)lVar4 != 0x10);
            uVar23 = uVar23 - 1;
            pjVar7 = pjVar7 + (uint)stride;
          } while (uVar23 != 0);
        }
        for (; iVar17 != 0; iVar17 = iVar17 + -1) {
          lVar4 = 0;
          do {
            pjVar11[lVar4] = pjVar11[lVar4] * 0x3406 >> 0xd;
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 0x10);
          pjVar11 = pjVar11 + (uint)stride;
        }
        pjVar11 = a;
        if (uVar2 == 0) {
          lVar4 = 0;
          do {
            a[lVar4] = a[lVar4] - (pjVar8[lVar4] * 0x1c62 >> 0xd);
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 0x10);
          pjVar11 = a + (uint)stride;
        }
        pjVar7 = a + uVar12;
        pjVar21 = pjVar7;
        pjVar1 = pjVar8;
        pjVar16 = local_68;
        for (iVar17 = iVar20; iVar17 != 0; iVar17 = iVar17 + -1) {
          lVar4 = 0;
          do {
            pjVar11[lVar4] = pjVar11[lVar4] - ((pjVar16[lVar4] + pjVar1[lVar4]) * 0xe31 >> 0xd);
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 0x10);
          pjVar11 = pjVar11 + (uint)stride;
          pjVar21 = pjVar1 + (uint)stride;
          pjVar16 = pjVar16 + (uint)stride;
          pjVar1 = pjVar21;
        }
        if (uVar22 != uVar2) {
          lVar4 = 0;
          do {
            pjVar11[lVar4] = pjVar11[lVar4] - (pjVar21[lVar4] * 0x1c62 >> 0xd);
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 0x10);
        }
        iVar17 = iVar24;
        pjVar11 = pjVar7;
        pjVar21 = a;
        pjVar1 = local_70;
        if (uVar2 != 0) {
          lVar4 = 0;
          do {
            pjVar8[lVar4] = pjVar8[lVar4] - (a[lVar4] * 0x3881 >> 0xd);
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 0x10);
          pjVar11 = pjVar7 + (uint)stride;
        }
        for (; iVar17 != 0; iVar17 = iVar17 + -1) {
          lVar4 = 0;
          do {
            pjVar11[lVar4] = pjVar11[lVar4] - ((pjVar1[lVar4] + pjVar21[lVar4]) * 0x1c40 >> 0xd);
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 0x10);
          pjVar11 = pjVar11 + (uint)stride;
          pjVar21 = pjVar21 + (uint)stride;
          pjVar1 = pjVar1 + (uint)stride;
        }
        if (uVar22 == uVar2) {
          lVar4 = 0;
          do {
            pjVar11[lVar4] = pjVar11[lVar4] - (pjVar21[lVar4] * 0x3881 >> 0xd);
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 0x10);
        }
        iVar17 = iVar20;
        pjVar21 = pjVar7;
        pjVar11 = a;
        pjVar1 = pjVar8;
        pjVar16 = local_68;
        if (uVar2 == 0) {
          lVar4 = 0;
          do {
            a[lVar4] = a[lVar4] - (pjVar8[lVar4] * -0x364 >> 0xd);
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 0x10);
          pjVar11 = a + (uint)stride;
        }
        for (; iVar17 != 0; iVar17 = iVar17 + -1) {
          lVar4 = 0;
          do {
            pjVar11[lVar4] = pjVar11[lVar4] - ((pjVar16[lVar4] + pjVar1[lVar4]) * -0x1b2 >> 0xd);
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 0x10);
          pjVar21 = pjVar1 + (uint)stride;
          pjVar11 = pjVar11 + (uint)stride;
          pjVar1 = pjVar1 + (uint)stride;
          pjVar16 = pjVar16 + (uint)stride;
        }
        if (uVar22 != uVar2) {
          lVar4 = 0;
          do {
            pjVar11[lVar4] = pjVar11[lVar4] - (pjVar21[lVar4] * -0x364 >> 0xd);
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 0x10);
        }
        iVar17 = iVar24;
        pjVar11 = a;
        pjVar21 = local_70;
        if (uVar2 != 0) {
          lVar4 = 0;
          do {
            pjVar8[lVar4] = pjVar8[lVar4] - (a[lVar4] * -0x6583 >> 0xd);
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 0x10);
          pjVar7 = pjVar7 + (uint)stride;
        }
        for (; iVar17 != 0; iVar17 = iVar17 + -1) {
          lVar4 = 0;
          do {
            pjVar7[lVar4] = pjVar7[lVar4] - ((pjVar21[lVar4] + pjVar11[lVar4]) * -0x32c1 >> 0xd);
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 0x10);
          pjVar7 = pjVar7 + (uint)stride;
          pjVar11 = pjVar11 + (uint)stride;
          pjVar21 = pjVar21 + (uint)stride;
        }
        if (uVar22 == uVar2) {
          lVar4 = 0;
          do {
            pjVar7[lVar4] = pjVar7[lVar4] - (pjVar11[lVar4] * -0x6583 >> 0xd);
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 0x10);
        }
      }
      jpc_qmfb_join_colgrp(a,height,stride,uVar2);
      a = a + 0x10;
      uVar18 = uVar18 + 0x10;
      pjVar8 = pjVar8 + 0x10;
      local_68 = local_68 + 0x10;
      local_70 = local_70 + 0x10;
    } while (uVar18 < uVar3);
  }
  if (uVar3 != width) {
    uVar3 = width & 0xf;
    if (1 < (uint)height) {
      uVar14 = (uVar2 ^ 1) + height;
      uVar18 = uVar14 >> 1;
      if (1 < uVar14) {
        pjVar8 = a;
        uVar14 = uVar18;
        do {
          if ((width & 0xfU) != 0) {
            lVar4 = 0;
            do {
              pjVar8[lVar4] = pjVar8[lVar4] * 0x275d >> 0xd;
              lVar4 = lVar4 + 1;
            } while (uVar3 != (uint)lVar4);
          }
          pjVar8 = pjVar8 + (uint)stride;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
      uVar12 = (ulong)(uVar18 * stride);
      pjVar8 = a + uVar12;
      iVar13 = height - uVar18;
      if (iVar13 != 0) {
        pjVar11 = pjVar8;
        iVar20 = iVar13;
        do {
          if ((width & 0xfU) != 0) {
            lVar4 = 0;
            do {
              pjVar11[lVar4] = pjVar11[lVar4] * 0x3406 >> 0xd;
              lVar4 = lVar4 + 1;
            } while (uVar3 != (uint)lVar4);
          }
          pjVar11 = pjVar11 + (uint)stride;
          iVar20 = iVar20 + -1;
        } while (iVar20 != 0);
      }
      pjVar11 = a;
      if (uVar2 == 0) {
        if ((width & 0xfU) != 0) {
          lVar4 = 0;
          do {
            a[lVar4] = a[lVar4] - (pjVar8[lVar4] * 0x1c62 >> 0xd);
            lVar4 = lVar4 + 1;
          } while (uVar3 != (uint)lVar4);
        }
        pjVar11 = a + (uint)stride;
      }
      uVar14 = height & 1;
      iVar20 = (uVar18 - (uVar2 == 0)) - (uint)(uVar14 != uVar2);
      pjVar7 = pjVar8;
      if (iVar20 != 0) {
        pjVar21 = a + (uint)stride + uVar12;
        iVar24 = iVar20;
        do {
          if ((width & 0xfU) != 0) {
            lVar4 = 0;
            do {
              pjVar11[lVar4] = pjVar11[lVar4] - ((pjVar21[lVar4] + pjVar7[lVar4]) * 0xe31 >> 0xd);
              lVar4 = lVar4 + 1;
            } while (uVar3 != (uint)lVar4);
          }
          pjVar11 = pjVar11 + (uint)stride;
          pjVar7 = pjVar7 + (uint)stride;
          pjVar21 = pjVar21 + (uint)stride;
          iVar24 = iVar24 + -1;
        } while (iVar24 != 0);
      }
      bVar25 = (width & 0xfU) != 0;
      if (bVar25 && uVar14 != uVar2) {
        lVar4 = 0;
        do {
          pjVar11[lVar4] = pjVar11[lVar4] - (pjVar7[lVar4] * 0x1c62 >> 0xd);
          lVar4 = lVar4 + 1;
        } while (uVar3 != (uint)lVar4);
      }
      pjVar11 = pjVar8;
      if (uVar2 != 0) {
        if ((width & 0xfU) != 0) {
          lVar4 = 0;
          do {
            pjVar8[lVar4] = pjVar8[lVar4] - (a[lVar4] * 0x3881 >> 0xd);
            lVar4 = lVar4 + 1;
          } while (uVar3 != (uint)lVar4);
        }
        pjVar11 = pjVar8 + (uint)stride;
      }
      iVar24 = (iVar13 - uVar2) - (uint)(uVar14 == uVar2);
      pjVar7 = a;
      pjVar21 = a;
      for (iVar13 = iVar24; iVar13 != 0; iVar13 = iVar13 + -1) {
        pjVar21 = pjVar21 + (uint)stride;
        if ((width & 0xfU) != 0) {
          lVar4 = 0;
          do {
            pjVar11[lVar4] = pjVar11[lVar4] - ((pjVar21[lVar4] + pjVar7[lVar4]) * 0x1c40 >> 0xd);
            lVar4 = lVar4 + 1;
          } while (uVar3 != (uint)lVar4);
        }
        pjVar11 = pjVar11 + (uint)stride;
        pjVar7 = pjVar7 + (uint)stride;
      }
      bVar26 = (width & 0xfU) != 0;
      if (bVar26 && uVar14 == uVar2) {
        lVar4 = 0;
        do {
          pjVar11[lVar4] = pjVar11[lVar4] - (pjVar7[lVar4] * 0x3881 >> 0xd);
          lVar4 = lVar4 + 1;
        } while (uVar3 != (uint)lVar4);
      }
      pjVar11 = a;
      if (uVar2 == 0) {
        if ((width & 0xfU) != 0) {
          lVar4 = 0;
          do {
            a[lVar4] = a[lVar4] - (pjVar8[lVar4] * -0x364 >> 0xd);
            lVar4 = lVar4 + 1;
          } while (uVar3 != (uint)lVar4);
        }
        pjVar11 = a + (uint)stride;
      }
      pjVar7 = pjVar8;
      if (iVar20 != 0) {
        pjVar21 = a + (uint)stride + uVar12;
        do {
          if ((width & 0xfU) != 0) {
            lVar4 = 0;
            do {
              pjVar11[lVar4] = pjVar11[lVar4] - ((pjVar21[lVar4] + pjVar7[lVar4]) * -0x1b2 >> 0xd);
              lVar4 = lVar4 + 1;
            } while (uVar3 != (uint)lVar4);
          }
          pjVar11 = pjVar11 + (uint)stride;
          pjVar7 = pjVar7 + (uint)stride;
          pjVar21 = pjVar21 + (uint)stride;
          iVar20 = iVar20 + -1;
        } while (iVar20 != 0);
      }
      if (bVar25 && uVar14 != uVar2) {
        lVar4 = 0;
        do {
          pjVar11[lVar4] = pjVar11[lVar4] - (pjVar7[lVar4] * -0x364 >> 0xd);
          lVar4 = lVar4 + 1;
        } while (uVar3 != (uint)lVar4);
      }
      if (uVar2 != 0) {
        if ((width & 0xfU) != 0) {
          lVar4 = 0;
          do {
            pjVar8[lVar4] = pjVar8[lVar4] - (a[lVar4] * -0x6583 >> 0xd);
            lVar4 = lVar4 + 1;
          } while (uVar3 != (uint)lVar4);
        }
        pjVar8 = pjVar8 + (uint)stride;
      }
      pjVar11 = a;
      if (iVar24 != 0) {
        pjVar7 = a;
        do {
          pjVar7 = pjVar7 + (uint)stride;
          if ((width & 0xfU) != 0) {
            lVar4 = 0;
            do {
              pjVar8[lVar4] = pjVar8[lVar4] - ((pjVar7[lVar4] + pjVar11[lVar4]) * -0x32c1 >> 0xd);
              lVar4 = lVar4 + 1;
            } while (uVar3 != (uint)lVar4);
          }
          pjVar8 = pjVar8 + (uint)stride;
          pjVar11 = pjVar11 + (uint)stride;
          iVar24 = iVar24 + -1;
        } while (iVar24 != 0);
      }
      if (bVar26 && uVar14 == uVar2) {
        lVar4 = 0;
        do {
          pjVar8[lVar4] = pjVar8[lVar4] - (pjVar11[lVar4] * -0x6583 >> 0xd);
          lVar4 = lVar4 + 1;
        } while (uVar3 != (uint)lVar4);
      }
    }
    jpc_qmfb_join_colres(a,height,uVar3,stride,uVar2);
  }
  return 0;
}

Assistant:

int jpc_ns_synthesize(jpc_fix_t *a, int xstart, int ystart, int width,
  int height, int stride)
{

	const unsigned numrows = height;
	const unsigned numcols = width;
	const unsigned rowparity = ystart & 1;
	const unsigned colparity = xstart & 1;
	jpc_fix_t *startptr;

	startptr = &a[0];
	for (unsigned i = 0; i < numrows; ++i) {
		jpc_ns_invlift_row(startptr, numcols, colparity);
		jpc_qmfb_join_row(startptr, numcols, colparity);
		startptr += stride;
	}

	const unsigned maxcols = (numcols / JPC_QMFB_COLGRPSIZE) * JPC_QMFB_COLGRPSIZE;
	startptr = &a[0];
	for (unsigned i = 0; i < maxcols; i += JPC_QMFB_COLGRPSIZE) {
		jpc_ns_invlift_colgrp(startptr, numrows, stride, rowparity);
		jpc_qmfb_join_colgrp(startptr, numrows, stride, rowparity);
		startptr += JPC_QMFB_COLGRPSIZE;
	}
	if (maxcols < numcols) {
		jpc_ns_invlift_colres(startptr, numrows, numcols - maxcols, stride,
		  rowparity);
		jpc_qmfb_join_colres(startptr, numrows, numcols - maxcols, stride,
		  rowparity);
	}

	return 0;

}